

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O2

int isobusfs_sendto(int sock,void *data,size_t len,sockaddr_can *addr,
                   isobusfs_buf_log *isobusfs_tx_buffer)

{
  ssize_t sVar1;
  int *piVar2;
  char *pcVar3;
  uint __errnum;
  
  isobufs_store_tx_data(isobusfs_tx_buffer,(uint8_t *)data);
  sVar1 = sendto(sock,data,len,0x40,(sockaddr *)addr,0x18);
  __errnum = 0;
  if ((int)sVar1 == -1) {
    piVar2 = __errno_location();
    __errnum = -*piVar2;
    pcVar3 = strerror(__errnum);
    isobusfs_log(LOG_LEVEL_WARN,"failed to send data: %i (%s)",(ulong)__errnum,pcVar3);
  }
  return __errnum;
}

Assistant:

int isobusfs_sendto(int sock, const void *data, size_t len,
		    const struct sockaddr_can *addr,
		    struct isobusfs_buf_log *isobusfs_tx_buffer)
{
	int ret;

	/* store to tx buffer */
	isobufs_store_tx_data(isobusfs_tx_buffer, (uint8_t *)data);

	ret = sendto(sock, data, len, MSG_DONTWAIT,
		     (struct sockaddr *)addr, sizeof(*addr));
	if (ret == -1) {
		ret = -errno;
		pr_warn("failed to send data: %i (%s)", ret, strerror(ret));
		return ret;
	}

	return 0;
}